

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

DistWeightSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::DistWeightSyntax,slang::parsing::Token,slang::parsing::Token,slang::syntax::ExpressionSyntax&>
          (BumpAllocator *this,Token *args,Token *args_1,ExpressionSyntax *args_2)

{
  Token extraOp;
  Token op;
  DistWeightSyntax *pDVar1;
  Info *in_RCX;
  long in_RDX;
  Info *in_RSI;
  size_t in_stack_ffffffffffffffc8;
  size_t in_stack_ffffffffffffffd0;
  BumpAllocator *in_stack_ffffffffffffffd8;
  
  pDVar1 = (DistWeightSyntax *)
           allocate(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  op.info = in_RSI;
  op.kind = (short)in_RDX;
  op._2_1_ = (char)((ulong)in_RDX >> 0x10);
  op.numFlags.raw = (char)((ulong)in_RDX >> 0x18);
  op.rawLen = (int)((ulong)in_RDX >> 0x20);
  extraOp.info = in_RCX;
  extraOp._0_8_ = in_RSI->location;
  slang::syntax::DistWeightSyntax::DistWeightSyntax
            ((DistWeightSyntax *)in_RSI->rawTextPtr,op,extraOp,*(ExpressionSyntax **)(in_RDX + 8));
  return pDVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }